

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O2

void xmlInitializeCatalog(void)

{
  xmlCatalogPtr pxVar1;
  byte bVar2;
  byte *pbVar3;
  xmlCatalogPtr pxVar4;
  xmlChar *URL;
  xmlCatalogEntryPtr pxVar5;
  byte *pbVar6;
  long lVar7;
  xmlCatalogEntryPtr local_38;
  
  if (xmlCatalogInitialized == '\0') {
    xmlInitParser();
    xmlRMutexLock(&xmlCatalogMutex);
    pxVar1 = xmlDefaultCatalog;
    if (xmlDefaultCatalog == (xmlCatalogPtr)0x0) {
      pbVar3 = (byte *)getenv("XML_CATALOG_FILES");
      pxVar4 = xmlCreateNewCatalog(XML_XML_CATALOG_TYPE,xmlCatalogDefaultPrefer);
      pxVar1 = xmlDefaultCatalog;
      if (pxVar4 != (xmlCatalogPtr)0x0) {
        pbVar6 = (byte *)"file:///usr/local/etc/xml/catalog";
        if (pbVar3 != (byte *)0x0) {
          pbVar6 = pbVar3;
        }
        local_38 = (xmlCatalogEntryPtr)&pxVar4->xml;
LAB_0015ff74:
        bVar2 = *pbVar6;
        pbVar3 = pbVar6;
        pxVar1 = pxVar4;
        if (bVar2 != 0) {
          while (bVar2 < 0x21) {
            if ((0x100002600U >> ((ulong)bVar2 & 0x3f) & 1) == 0) {
              pbVar6 = pbVar3;
              if ((ulong)bVar2 == 0) goto LAB_0015ff74;
              break;
            }
            bVar2 = pbVar3[1];
            pbVar3 = pbVar3 + 1;
          }
          lVar7 = 0;
          while ((0x20 < bVar2 || ((0x100002601U >> ((ulong)bVar2 & 0x3f) & 1) == 0))) {
            bVar2 = pbVar3[lVar7 + 1];
            lVar7 = lVar7 + 1;
          }
          URL = xmlStrndup(pbVar3,(int)lVar7);
          pbVar6 = pbVar3 + lVar7;
          if (URL != (xmlChar *)0x0) {
            pxVar5 = xmlNewCatalogEntry(XML_CATA_CATALOG,(xmlChar *)0x0,(xmlChar *)0x0,URL,
                                        xmlCatalogDefaultPrefer,(xmlCatalogEntryPtr)0x0);
            local_38->next = pxVar5;
            if (pxVar5 != (xmlCatalogEntryPtr)0x0) {
              local_38 = pxVar5;
            }
            (*xmlFree)(URL);
            pbVar6 = pbVar3 + lVar7;
          }
          goto LAB_0015ff74;
        }
      }
    }
    xmlDefaultCatalog = pxVar1;
    xmlRMutexUnlock(&xmlCatalogMutex);
    xmlCatalogInitialized = '\x01';
  }
  return;
}

Assistant:

void
xmlInitializeCatalog(void) {
    if (xmlCatalogInitialized != 0)
	return;

    xmlInitParser();

    xmlRMutexLock(&xmlCatalogMutex);

    if (xmlDefaultCatalog == NULL) {
	const char *catalogs;
	char *path;
	const char *cur, *paths;
	xmlCatalogPtr catal;
	xmlCatalogEntryPtr *nextent;

	catalogs = (const char *) getenv("XML_CATALOG_FILES");
	if (catalogs == NULL)
	    catalogs = XML_XML_DEFAULT_CATALOG;

	catal = xmlCreateNewCatalog(XML_XML_CATALOG_TYPE,
		xmlCatalogDefaultPrefer);
	if (catal != NULL) {
	    /* the XML_CATALOG_FILES envvar is allowed to contain a
	       space-separated list of entries. */
	    cur = catalogs;
	    nextent = &catal->xml;
	    while (*cur != '\0') {
		while (xmlIsBlank_ch(*cur))
		    cur++;
		if (*cur != 0) {
		    paths = cur;
		    while ((*cur != 0) && (!xmlIsBlank_ch(*cur)))
			cur++;
		    path = (char *) xmlStrndup((const xmlChar *)paths, cur - paths);
		    if (path != NULL) {
			*nextent = xmlNewCatalogEntry(XML_CATA_CATALOG, NULL,
				NULL, BAD_CAST path, xmlCatalogDefaultPrefer, NULL);
			if (*nextent != NULL)
			    nextent = &((*nextent)->next);
			xmlFree(path);
		    }
		}
	    }
	    xmlDefaultCatalog = catal;
	}
    }

    xmlRMutexUnlock(&xmlCatalogMutex);

    xmlCatalogInitialized = 1;
}